

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O2

Lazy<void> __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::alive_detect
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          config *client_config,
          weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
          *watcher)

{
  __base_type _Var1;
  element_type *peVar2;
  
  peVar2 = (element_type *)operator_new(0xa0,(nothrow_t *)&std::nothrow);
  if (peVar2 == (element_type *)0x0) {
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  else {
    *(code **)&(peVar2->
               super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
               )._M_weak_this.
               super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
         = alive_detect;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->
            super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
            )._M_weak_this.
            super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    + 8))->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)alive_detect;
    *(config **)((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x18)
         = client_config;
    _Var1._M_p = (__pointer_type)
                 (watcher->
                 super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
    (peVar2->free_clients_).queue_[0].initialBlockPoolSize =
         (size_t)(watcher->
                 super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    (peVar2->free_clients_).queue_[0].freeList.freeListHead._M_b._M_p = _Var1._M_p;
    (watcher->
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = (element_type *)0x0;
    (watcher->
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peVar2->free_clients_).queue_[0].initialBlockPoolIndex.super___atomic_base<unsigned_long>._M_i
         = 0;
    (peVar2->free_clients_).queue_[0].initialBlockPool = (Block *)0x0;
    (peVar2->free_clients_).queue_[0].producerListTail._M_b = (__base_type)0x0;
    *(undefined8 *)&(peVar2->free_clients_).queue_[0].producerCount = 0;
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    *(undefined1 *)
     &(((ImplicitProducerKVP *)
       ((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x30))->key).
      super___atomic_base<unsigned_long>._M_i = 0;
  }
  return (LazyBase<void,_false>)(LazyBase<void,_false>)this;
}

Assistant:

static async_simple::coro::Lazy<void> alive_detect(
      const typename client_t::config& client_config,
      std::weak_ptr<client_pool> watcher) {
    std::shared_ptr<client_pool> self = watcher.lock();
    using namespace std::chrono_literals;
    if (self && self->pool_config_.host_alive_detect_duration.count() != 0 &&
        self->free_client_count() == 0) {
      bool expected = true;
      if (!self->is_alive_.compare_exchange_strong(
              expected, false)) {  // other alive detect coroutine is running.
        co_return;
      }
      if (self->free_client_count() > 0) {  // recheck for multi-thread
        self->is_alive_ = true;
        co_return;
      }
      auto executor = self->io_context_pool_.get_executor();
      auto client = std::make_unique<client_t>(*executor);
      if (!client->init_config(client_config))
        AS_UNLIKELY {
          CINATRA_LOG_ERROR
              << "Init client config failed in host alive detect. That "
                 "is not expected.";
          co_return;
        }
      while (true) {
        auto [ok, cost_time] = co_await reconnect_impl(client, self);
        if (ok) {
          CINATRA_LOG_TRACE << "reconnect client{" << client.get()
                            << "} success. stop alive detect.";
          self->collect_free_client(std::move(client));
          self->is_alive_ =
              true; /*if client close(), we still mark it as alive*/
          co_return;
        }
        if (self->is_alive_) {
          CINATRA_LOG_TRACE << "client pool is aliving, stop connect client {"
                            << client.get() << "} for alive detect";
          co_return;
        }
        CINATRA_LOG_TRACE << "reconnect client{" << client.get()
                          << "} failed. continue alive detect.";
        auto wait_time = rand_time(
            (self->pool_config_.host_alive_detect_duration - cost_time) / 1ms *
            1ms);
        self = nullptr;
        if (wait_time.count() > 0) {
          co_await coro_io::sleep_for(wait_time, &client->get_executor());
        }
        self = watcher.lock();
        if (self->is_alive_) {
          CINATRA_LOG_TRACE << "client pool is aliving, stop connect client {"
                            << client.get() << "} for alive detect";
          co_return;
        }
      }
    }